

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int VP8LGetHistoImageSymbols
              (int xsize,int ysize,VP8LBackwardRefs *refs,int quality,int low_effort,
              int histogram_bits,int cache_bits,VP8LHistogramSet *image_histo,
              VP8LHistogram *tmp_histo,uint32_t *histogram_symbols,WebPPicture *pic,
              int percent_range,int *percent)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t percent_00;
  int iVar3;
  int iVar4;
  uint uVar5;
  VP8LHistogramSet *orig_histo_00;
  int in_ECX;
  VP8LHistogramSet *in_RDX;
  uint32_t in_ESI;
  uint32_t in_EDI;
  int in_R8D;
  uint32_t in_R9D;
  VP8LHistogramSet *unaff_retaddr;
  int *in_stack_00000010;
  int do_greedy;
  int threshold_size;
  int32_t combine_cost_factor;
  int entropy_combine;
  int entropy_combine_num_bins;
  VP8LHistogramSet *orig_histo;
  int image_histo_raw_size;
  int histo_ysize;
  int histo_xsize;
  int in_stack_000000ec;
  int32_t in_stack_000000f0;
  int in_stack_000000f4;
  VP8LHistogram *in_stack_000000f8;
  VP8LHistogramSet *in_stack_00000100;
  int *in_stack_ffffffffffffffa8;
  bool local_4d;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint32_t uVar6;
  
  if (in_R9D == 0) {
    uVar2 = 1;
  }
  else {
    uVar2 = VP8LSubSampleSize(in_EDI,in_R9D);
  }
  uVar6 = uVar2;
  if (in_R9D == 0) {
    percent_00 = 1;
  }
  else {
    percent_00 = VP8LSubSampleSize(in_ESI,in_R9D);
  }
  iVar3 = uVar6 * percent_00;
  orig_histo_00 = VP8LAllocateHistogramSet(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  iVar4 = 0x40;
  if (in_R8D != 0) {
    iVar4 = 4;
  }
  if (orig_histo_00 == (VP8LHistogramSet *)0x0) {
    WebPEncodingSetError((WebPPicture *)orig_histo,VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto LAB_00199f16;
  }
  HistogramBuild((int)((ulong)in_RDX >> 0x20),(int)in_RDX,
                 (VP8LBackwardRefs *)CONCAT44(in_ECX,in_R8D),
                 (VP8LHistogramSet *)CONCAT44(in_R9D,uVar6));
  HistogramCopyAndAnalyze
            (orig_histo_00,(VP8LHistogramSet *)CONCAT44(iVar4,in_stack_ffffffffffffffc8));
  iVar1 = *in_stack_00000010;
  local_4d = (iVar1 != iVar4 * 2 && SBORROW4(iVar1,iVar4 * 2) == iVar1 + iVar4 * -2 < 0) &&
             in_ECX < 100;
  uVar5 = (uint)local_4d;
  if (uVar5 != 0) {
    GetCombineCostFactor(iVar3,in_ECX);
    HistogramAnalyzeEntropyBin(in_RDX,in_ECX);
    HistogramCombineEntropyBin
              (in_stack_00000100,in_stack_000000f8,in_stack_000000f4,in_stack_000000f0,
               in_stack_000000ec);
  }
  if ((in_R8D == 0) || (uVar5 == 0)) {
    DivRound((long)(in_ECX * in_ECX * in_ECX * 99),1000000);
    iVar3 = HistogramCombineStochastic
                      ((VP8LHistogramSet *)refs,quality,(int *)CONCAT44(histogram_bits,histo_xsize))
    ;
    if (iVar3 == 0) {
      WebPEncodingSetError((WebPPicture *)orig_histo,VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto LAB_00199f16;
    }
    if ((in_stack_ffffffffffffffbc != 0) &&
       (iVar3 = HistogramCombineGreedy((VP8LHistogramSet *)CONCAT44(in_R9D,uVar6)), iVar3 == 0)) {
      WebPEncodingSetError((WebPPicture *)orig_histo,VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto LAB_00199f16;
    }
  }
  HistogramRemap(unaff_retaddr,(VP8LHistogramSet *)CONCAT44(in_EDI,in_ESI),(uint32_t *)in_RDX);
  WebPReportProgress((WebPPicture *)CONCAT44(in_stack_ffffffffffffffbc,uVar2),percent_00,
                     in_stack_ffffffffffffffa8);
LAB_00199f16:
  VP8LFreeHistogramSet((VP8LHistogramSet *)0x199f20);
  return (int)(*(int *)&orig_histo[8].histograms == 0);
}

Assistant:

int VP8LGetHistoImageSymbols(int xsize, int ysize,
                             const VP8LBackwardRefs* const refs, int quality,
                             int low_effort, int histogram_bits, int cache_bits,
                             VP8LHistogramSet* const image_histo,
                             VP8LHistogram* const tmp_histo,
                             uint32_t* const histogram_symbols,
                             const WebPPicture* const pic, int percent_range,
                             int* const percent) {
  const int histo_xsize =
      histogram_bits ? VP8LSubSampleSize(xsize, histogram_bits) : 1;
  const int histo_ysize =
      histogram_bits ? VP8LSubSampleSize(ysize, histogram_bits) : 1;
  const int image_histo_raw_size = histo_xsize * histo_ysize;
  VP8LHistogramSet* const orig_histo =
      VP8LAllocateHistogramSet(image_histo_raw_size, cache_bits);
  // Don't attempt linear bin-partition heuristic for
  // histograms of small sizes (as bin_map will be very sparse) and
  // maximum quality q==100 (to preserve the compression gains at that level).
  const int entropy_combine_num_bins = low_effort ? NUM_PARTITIONS : BIN_SIZE;
  int entropy_combine;
  if (orig_histo == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Construct the histograms from backward references.
  HistogramBuild(xsize, histogram_bits, refs, orig_histo);
  HistogramCopyAndAnalyze(orig_histo, image_histo);
  entropy_combine =
      (image_histo->size > entropy_combine_num_bins * 2) && (quality < 100);

  if (entropy_combine) {
    const int32_t combine_cost_factor =
        GetCombineCostFactor(image_histo_raw_size, quality);

    HistogramAnalyzeEntropyBin(image_histo, low_effort);
    // Collapse histograms with similar entropy.
    HistogramCombineEntropyBin(image_histo, tmp_histo, entropy_combine_num_bins,
                               combine_cost_factor, low_effort);
  }

  // Don't combine the histograms using stochastic and greedy heuristics for
  // low-effort compression mode.
  if (!low_effort || !entropy_combine) {
    // cubic ramp between 1 and MAX_HISTO_GREEDY:
    const int threshold_size =
        (int)(1 + DivRound(quality * quality * quality * (MAX_HISTO_GREEDY - 1),
                           100 * 100 * 100));
    int do_greedy;
    if (!HistogramCombineStochastic(image_histo, threshold_size, &do_greedy)) {
      WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto Error;
    }
    if (do_greedy) {
      if (!HistogramCombineGreedy(image_histo)) {
        WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
    }
  }

  // Find the optimal map from original histograms to the final ones.
  HistogramRemap(orig_histo, image_histo, histogram_symbols);

  if (!WebPReportProgress(pic, *percent + percent_range, percent)) {
    goto Error;
  }

 Error:
  VP8LFreeHistogramSet(orig_histo);
  return (pic->error_code == VP8_ENC_OK);
}